

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

size_t gc_onestep(lua_State *L)

{
  GCSize *pGVar1;
  uint uVar2;
  global_State *g;
  GCSize GVar3;
  byte bVar4;
  int iVar5;
  GCRef *pGVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  GCtab *t;
  uint64_t uVar11;
  GCobj *pGVar12;
  GCobj *o;
  cTValue *pcVar13;
  long lVar14;
  undefined1 *puVar15;
  long lVar16;
  
  g = (global_State *)(L->glref).ptr64;
  switch((g->gc).state) {
  case '\0':
    (g->gc).gray.gcptr64 = 0;
    (g->gc).grayagain.gcptr64 = 0;
    (g->gc).weak.gcptr64 = 0;
    pGVar12 = (GCobj *)(g->mainthref).gcptr64;
    if (((pGVar12->gch).marked & 3) != 0) {
      gc_mark(g,pGVar12);
    }
    pGVar12 = *(GCobj **)((g->mainthref).gcptr64 + 0x48);
    if (((pGVar12->gch).marked & 3) != 0) {
      gc_mark(g,pGVar12);
    }
    if ((((int)(g->registrytv).field_4.it >> 0xf) + 0xdU < 9) &&
       (pGVar12 = (GCobj *)((ulong)(g->registrytv).field_4 & 0x7fffffffffff),
       ((pGVar12->gch).marked & 3) != 0)) {
      gc_mark(g,pGVar12);
    }
    gc_mark_gcroot(g);
    (g->gc).state = '\x01';
    break;
  case '\x01':
    if ((g->gc).gray.gcptr64 != 0) {
      sVar7 = propagatemark(g);
      return sVar7;
    }
    (g->gc).state = '\x02';
    break;
  case '\x02':
    if ((g->jit_base).ptr64 != 0) {
      return 0x800000000000;
    }
    for (puVar15 = *(undefined1 **)((long)&(g->uvhead).field_5 + 8);
        &g->uvhead != (GCupval *)puVar15; puVar15 = *(undefined1 **)(puVar15 + 0x18)) {
      if ((((puVar15[8] & 7) == 0) && ((int)((long)**(ulong **)(puVar15 + 0x20) >> 0x2f) + 0xdU < 9)
          ) && (pGVar12 = (GCobj *)(**(ulong **)(puVar15 + 0x20) & 0x7fffffffffff),
               ((pGVar12->gch).marked & 3) != 0)) {
        gc_mark(g,pGVar12);
      }
    }
    while ((g->gc).gray.gcptr64 != 0) {
      propagatemark(g);
    }
    (g->gc).gray.gcptr64 = (g->gc).weak.gcptr64;
    (g->gc).weak.gcptr64 = 0;
    if ((L->marked & 3) != 0) {
      gc_mark(g,(GCobj *)L);
    }
    gc_traverse_trace(g,(GCtrace *)(g + 1));
    gc_mark_gcroot(g);
    while ((g->gc).gray.gcptr64 != 0) {
      propagatemark(g);
    }
    uVar11 = (g->gc).grayagain.gcptr64;
    (g->gc).gray.gcptr64 = uVar11;
    (g->gc).grayagain.gcptr64 = 0;
    while (uVar11 != 0) {
      propagatemark(g);
      uVar11 = (g->gc).gray.gcptr64;
    }
    sVar7 = lj_gc_separateudata(g,0);
    pGVar12 = (GCobj *)(g->gc).mmudata.gcptr64;
    o = pGVar12;
    if (pGVar12 != (GCobj *)0x0) {
      do {
        o = *(GCobj **)o;
        (o->gch).marked = (g->gc).currentwhite & 3 | (o->gch).marked & 0xf8;
        gc_mark(g,o);
      } while (o != pGVar12);
    }
    if ((g->gc).gray.gcptr64 == 0) {
      lVar14 = 0;
    }
    else {
      lVar14 = 0;
      do {
        sVar8 = propagatemark(g);
        lVar14 = lVar14 + sVar8;
      } while ((g->gc).gray.gcptr64 != 0);
    }
    for (uVar11 = (g->gc).weak.gcptr64; uVar11 != 0; uVar11 = *(uint64_t *)(uVar11 + 0x18)) {
      if (((*(byte *)(uVar11 + 8) & 0x10) != 0) &&
         (uVar2 = *(uint *)(uVar11 + 0x30), (ulong)uVar2 != 0)) {
        lVar16 = 0;
        do {
          pcVar13 = (cTValue *)(*(long *)(uVar11 + 0x10) + lVar16);
          iVar5 = gc_mayclear(pcVar13,1);
          if (iVar5 != 0) {
            pcVar13->u64 = 0xffffffffffffffff;
          }
          lVar16 = lVar16 + 8;
        } while ((ulong)uVar2 << 3 != lVar16);
      }
      uVar2 = *(uint *)(uVar11 + 0x34);
      if (uVar2 != 0) {
        lVar16 = *(long *)(uVar11 + 0x28);
        uVar10 = 0;
        do {
          if (*(long *)(lVar16 + uVar10 * 0x18) != -1) {
            pcVar13 = (cTValue *)(lVar16 + uVar10 * 0x18);
            iVar5 = gc_mayclear(pcVar13 + 1,0);
            if ((iVar5 != 0) || (iVar5 = gc_mayclear(pcVar13,1), iVar5 != 0)) {
              pcVar13->u64 = 0xffffffffffffffff;
            }
          }
          uVar9 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar9;
        } while (uVar9 <= uVar2);
      }
    }
    lj_buf_shrink(L,&g->tmpbuf);
    bVar4 = (g->gc).currentwhite ^ 3;
    (g->gc).currentwhite = bVar4;
    (g->strempty).marked = bVar4;
    (g->gc).sweep.ptr64 = (uint64_t)&(g->gc).root;
    (g->gc).estimate = (g->gc).total - (lVar14 + sVar7);
    (g->gc).state = '\x03';
    (g->gc).sweepstr = 0;
    break;
  case '\x03':
    GVar3 = (g->gc).total;
    uVar2 = (g->gc).sweepstr;
    (g->gc).sweepstr = uVar2 + 1;
    gc_sweepstr(g,(g->str).tab + uVar2);
    if ((g->str).mask < (g->gc).sweepstr) {
      (g->gc).state = '\x04';
    }
    pGVar1 = &(g->gc).estimate;
    *pGVar1 = *pGVar1 + ((g->gc).total - GVar3);
    return 10;
  case '\x04':
    GVar3 = (g->gc).total;
    pGVar6 = gc_sweep(g,(GCRef *)(g->gc).sweep.ptr64,0x28);
    (g->gc).sweep.ptr64 = (uint64_t)pGVar6;
    pGVar1 = &(g->gc).estimate;
    *pGVar1 = *pGVar1 + ((g->gc).total - GVar3);
    if (pGVar6->gcptr64 != 0) {
      return 400;
    }
    uVar2 = (g->str).mask;
    if ((0x1ff < uVar2) && ((g->str).num <= uVar2 >> 2)) {
      lj_str_resize(L,uVar2 >> 1);
    }
    if ((g->gc).mmudata.gcptr64 == 0) {
      (g->gc).state = '\0';
      (g->gc).debt = 0;
      return 400;
    }
    (g->gc).state = '\x05';
    (g->gc).nocdatafin = '\x01';
    return 400;
  case '\x05':
    if ((g->gc).mmudata.gcptr64 != 0) {
      if ((g->jit_base).ptr64 != 0) {
        return 0x800000000000;
      }
      gc_finalize(L);
      uVar10 = (g->gc).estimate;
      if (100 < uVar10) {
        (g->gc).estimate = uVar10 - 100;
        return 100;
      }
      return 100;
    }
    if ((g->gc).nocdatafin == '\0') {
      lj_tab_rehash(L,*(GCtab **)((g->ctype_state).ptr64 + 0x20));
    }
    (g->gc).state = '\0';
    (g->gc).debt = 0;
  }
  return 0;
}

Assistant:

static size_t gc_onestep(lua_State *L)
{
  global_State *g = G(L);
  switch (g->gc.state) {
  case GCSpause:
    gc_mark_start(g);  /* Start a new GC cycle by marking all GC roots. */
    return 0;
  case GCSpropagate:
    if (gcref(g->gc.gray) != NULL)
      return propagatemark(g);  /* Propagate one gray object. */
    g->gc.state = GCSatomic;  /* End of mark phase. */
    return 0;
  case GCSatomic:
    if (tvref(g->jit_base))  /* Don't run atomic phase on trace. */
      return LJ_MAX_MEM;
    atomic(g, L);
    g->gc.state = GCSsweepstring;  /* Start of sweep phase. */
    g->gc.sweepstr = 0;
    return 0;
  case GCSsweepstring: {
    GCSize old = g->gc.total;
    gc_sweepstr(g, &g->str.tab[g->gc.sweepstr++]);  /* Sweep one chain. */
    if (g->gc.sweepstr > g->str.mask)
      g->gc.state = GCSsweep;  /* All string hash chains sweeped. */
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    return GCSWEEPCOST;
    }
  case GCSsweep: {
    GCSize old = g->gc.total;
    setmref(g->gc.sweep, gc_sweep(g, mref(g->gc.sweep, GCRef), GCSWEEPMAX));
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    if (gcref(*mref(g->gc.sweep, GCRef)) == NULL) {
      if (g->str.num <= (g->str.mask >> 2) && g->str.mask > LJ_MIN_STRTAB*2-1)
	lj_str_resize(L, g->str.mask >> 1);  /* Shrink string table. */
      if (gcref(g->gc.mmudata)) {  /* Need any finalizations? */
	g->gc.state = GCSfinalize;
#if LJ_HASFFI
	g->gc.nocdatafin = 1;
#endif
      } else {  /* Otherwise skip this phase to help the JIT. */
	g->gc.state = GCSpause;  /* End of GC cycle. */
	g->gc.debt = 0;
      }
    }
    return GCSWEEPMAX*GCSWEEPCOST;
    }
  case GCSfinalize:
    if (gcref(g->gc.mmudata) != NULL) {
      if (tvref(g->jit_base))  /* Don't call finalizers on trace. */
	return LJ_MAX_MEM;
      gc_finalize(L);  /* Finalize one userdata object. */
      if (g->gc.estimate > GCFINALIZECOST)
	g->gc.estimate -= GCFINALIZECOST;
      return GCFINALIZECOST;
    }
#if LJ_HASFFI
    if (!g->gc.nocdatafin) lj_tab_rehash(L, ctype_ctsG(g)->finalizer);
#endif
    g->gc.state = GCSpause;  /* End of GC cycle. */
    g->gc.debt = 0;
    return 0;
  default:
    lj_assertG(0, "bad GC state");
    return 0;
  }
}